

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_buffer.cpp
# Opt level: O2

void __thiscall BmsBuffer::MagnifyBy(BmsBuffer *this,double multiplier)

{
  _Rb_tree_node_base *p_Var1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  int local_34;
  double local_30;
  
  if ((int)(this->array_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_30 = multiplier;
    p_Var1 = (_Rb_tree_node_base *)
             std::_Rb_tree_decrement(&(this->array_)._M_t._M_impl.super__Rb_tree_header._M_header);
    while( true ) {
      pmVar2 = std::
               map<int,_BmsWord,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>::
               operator[](&this->array_,(key_type *)(p_Var1 + 1));
      local_34 = (int)((double)(int)p_Var1[1]._M_color * local_30);
      pmVar3 = std::
               map<int,_BmsWord,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>::
               operator[](&this->array_,&local_34);
      pmVar3->value_ = pmVar2->value_;
      DeleteAt(this,p_Var1[1]._M_color);
      if (p_Var1 == (this->array_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) break;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var1);
    }
  }
  return;
}

Assistant:

void
BmsBuffer::MagnifyBy(double multiplier)
{
	if (GetObjectCount() == 0) return;
	for (auto it = --End();; --it) {
		array_[it->first * multiplier] = array_[it->first];
		DeleteAt(it->first);
		if (it == Begin()) break;
	}
}